

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O0

int bip32_key_from_seed_custom_alloc
              (uchar *bytes,size_t bytes_len,uint32_t version,uchar *hmac_key,size_t hmac_key_len,
              uint32_t flags,ext_key **output)

{
  ext_key *peVar1;
  int ret;
  uint32_t flags_local;
  size_t hmac_key_len_local;
  uchar *hmac_key_local;
  uint32_t version_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  if (output == (ext_key **)0x0) {
    bytes_local._4_4_ = -2;
  }
  else {
    peVar1 = (ext_key *)wally_calloc(0xc0);
    *output = peVar1;
    if (*output == (ext_key *)0x0) {
      bytes_local._4_4_ = -3;
    }
    else {
      bytes_local._4_4_ =
           bip32_key_from_seed_custom(bytes,bytes_len,version,hmac_key,hmac_key_len,flags,*output);
      if (bytes_local._4_4_ != 0) {
        wally_free(*output);
        *output = (ext_key *)0x0;
      }
    }
  }
  return bytes_local._4_4_;
}

Assistant:

int bip32_key_from_seed_custom_alloc(const unsigned char *bytes, size_t bytes_len,
                                     uint32_t version,
                                     const unsigned char *hmac_key, size_t hmac_key_len,
                                     uint32_t flags, struct ext_key **output)
{
    int ret;

    ALLOC_KEY();
    ret = bip32_key_from_seed_custom(bytes, bytes_len, version,
                                     hmac_key, hmac_key_len, flags, *output);
    if (ret != WALLY_OK) {
        wally_free((void *)*output);
        *output = NULL;
    }
    return ret;
}